

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

lua_State * lua_newstate(lua_Alloc f,void *ud,uint seed)

{
  lu_byte lVar1;
  TStatus TVar2;
  global_State *g_00;
  TValue *io;
  global_State *g;
  lua_State *L;
  int i;
  uint seed_local;
  void *ud_local;
  lua_Alloc f_local;
  
  g_00 = (global_State *)(*f)(ud,(void *)0x0,8,0x658);
  if (g_00 == (global_State *)0x0) {
    f_local = (lua_Alloc)0x0;
  }
  else {
    g = (global_State *)&(g_00->mainth).l;
    (g_00->mainth).l.tt = '\b';
    g_00->currentwhite = '\b';
    (g_00->mainth).l.marked = g_00->currentwhite & 0x18;
    preinit_thread((lua_State *)g,g_00);
    g_00->allgc = (GCObject *)g;
    ((lua_State *)g)->next = (GCObject *)0x0;
    (g_00->mainth).l.nCcalls = (g_00->mainth).l.nCcalls + 0x10000;
    g_00->frealloc = f;
    g_00->ud = ud;
    g_00->warnf = (lua_WarnFunction)0x0;
    g_00->ud_warn = (void *)0x0;
    g_00->seed = seed;
    g_00->gcstp = '\x02';
    (g_00->strt).nuse = 0;
    (g_00->strt).size = 0;
    (g_00->strt).hash = (TString **)0x0;
    (g_00->l_registry).tt_ = '\0';
    g_00->panic = (lua_CFunction)0x0;
    g_00->gcstate = '\b';
    g_00->gckind = '\0';
    g_00->gcstopem = '\0';
    g_00->gcemergency = '\0';
    g_00->fixedgc = (GCObject *)0x0;
    g_00->tobefnz = (GCObject *)0x0;
    g_00->finobj = (GCObject *)0x0;
    g_00->reallyold = (GCObject *)0x0;
    g_00->old1 = (GCObject *)0x0;
    g_00->survival = (GCObject *)0x0;
    g_00->firstold1 = (GCObject *)0x0;
    g_00->finobjrold = (GCObject *)0x0;
    g_00->finobjold1 = (GCObject *)0x0;
    g_00->finobjsur = (GCObject *)0x0;
    g_00->sweepgc = (GCObject **)0x0;
    g_00->grayagain = (GCObject *)0x0;
    g_00->gray = (GCObject *)0x0;
    g_00->allweak = (GCObject *)0x0;
    g_00->ephemeron = (GCObject *)0x0;
    g_00->weak = (GCObject *)0x0;
    g_00->twups = (lua_State *)0x0;
    g_00->GCtotalbytes = 0x658;
    g_00->GCmarked = 0;
    g_00->GCdebt = 0;
    (g_00->nilvalue).value_.gc = (GCObject *)0x0;
    (g_00->nilvalue).tt_ = '\x03';
    lVar1 = luaO_codeparam(0xfa);
    g_00->gcparams[3] = lVar1;
    lVar1 = luaO_codeparam(200);
    g_00->gcparams[4] = lVar1;
    lVar1 = luaO_codeparam(0x2580);
    g_00->gcparams[5] = lVar1;
    lVar1 = luaO_codeparam(0x14);
    g_00->gcparams[0] = lVar1;
    lVar1 = luaO_codeparam(0x46);
    g_00->gcparams[2] = lVar1;
    lVar1 = luaO_codeparam(0x32);
    g_00->gcparams[1] = lVar1;
    for (L._0_4_ = 0; (int)L < 9; L._0_4_ = (int)L + 1) {
      g_00->mt[(int)L] = (Table *)0x0;
    }
    TVar2 = luaD_rawrunprotected((lua_State *)g,f_luaopen,(void *)0x0);
    if (TVar2 != '\0') {
      close_state((lua_State *)g);
      g = (global_State *)0x0;
    }
    f_local = (lua_Alloc)g;
  }
  return (lua_State *)f_local;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud, unsigned seed) {
  int i;
  lua_State *L;
  global_State *g = cast(global_State*,
                       (*f)(ud, NULL, LUA_TTHREAD, sizeof(global_State)));
  if (g == NULL) return NULL;
  L = &g->mainth.l;
  L->tt = LUA_VTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->allgc = obj2gco(L);  /* by now, only object is the main thread */
  L->next = NULL;
  incnny(L);  /* main thread is always non yieldable */
  g->frealloc = f;
  g->ud = ud;
  g->warnf = NULL;
  g->ud_warn = NULL;
  g->seed = seed;
  g->gcstp = GCSTPGC;  /* no GC while building state */
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->gcstopem = 0;
  g->gcemergency = 0;
  g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->firstold1 = g->survival = g->old1 = g->reallyold = NULL;
  g->finobjsur = g->finobjold1 = g->finobjrold = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->GCtotalbytes = sizeof(global_State);
  g->GCmarked = 0;
  g->GCdebt = 0;
  setivalue(&g->nilvalue, 0);  /* to signal that state is not yet built */
  setgcparam(g, PAUSE, LUAI_GCPAUSE);
  setgcparam(g, STEPMUL, LUAI_GCMUL);
  setgcparam(g, STEPSIZE, LUAI_GCSTEPSIZE);
  setgcparam(g, MINORMUL, LUAI_GENMINORMUL);
  setgcparam(g, MINORMAJOR, LUAI_MINORMAJOR);
  setgcparam(g, MAJORMINOR, LUAI_MAJORMINOR);
  for (i=0; i < LUA_NUMTYPES; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  return L;
}